

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::Shape::writeTo(Shape *this,BinaryWriter *binary)

{
  int32_t local_34;
  shared_ptr<pbrt::AreaLight> local_30;
  SP local_20;
  
  local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->material).super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity;
  local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->material).super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_34 = BinaryWriter::serialize(binary,&local_20);
  BinaryWriter::writeRaw(binary,&local_34,4);
  if (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  BinaryWriter::write<std::__cxx11::string,pbrt::Texture>(binary,&this->textures);
  local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->areaLight).super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->areaLight).super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  BinaryWriter::write<pbrt::AreaLight>(binary,&local_30);
  if (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_34 = CONCAT31(local_34._1_3_,this->reverseOrientation);
  BinaryWriter::writeRaw(binary,&local_34,1);
  BinaryWriter::writeRaw(binary,&this->alpha,4);
  return 3;
}

Assistant:

int Shape::writeTo(BinaryWriter &binary) 
  {
    binary.write(binary.serialize(material));
    binary.write(textures);
    binary.write(areaLight);
    binary.write((int8_t)reverseOrientation);
    binary.write(alpha);
    return TYPE_SHAPE;
  }